

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

void helper_psllw_mmx_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  ulong uVar1;
  undefined1 auVar2 [12];
  uint64_t uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar5 [16];
  undefined2 uVar8;
  
  uVar3 = 0;
  if (s->_q_MMXReg[0] < 0x10) {
    uVar1 = d->_q_MMXReg[0];
    uVar8 = (undefined2)(uVar1 >> 0x30);
    auVar5._8_4_ = 0;
    auVar5._0_8_ = uVar1;
    auVar5._12_2_ = uVar8;
    auVar5._14_2_ = uVar8;
    uVar8 = (undefined2)(uVar1 >> 0x20);
    auVar4._12_4_ = auVar5._12_4_;
    auVar4._8_2_ = 0;
    auVar4._0_8_ = uVar1;
    auVar4._10_2_ = uVar8;
    auVar7._10_6_ = auVar4._10_6_;
    auVar7._8_2_ = uVar8;
    auVar7._0_8_ = uVar1;
    uVar8 = (undefined2)(uVar1 >> 0x10);
    auVar2._4_8_ = auVar7._8_8_;
    auVar2._2_2_ = uVar8;
    auVar2._0_2_ = uVar8;
    auVar6._0_4_ = CONCAT22((short)uVar1,(short)uVar1) << (int)s->_q_MMXReg[0];
    auVar6._4_4_ = auVar2._0_4_;
    auVar6._8_4_ = auVar7._8_4_;
    auVar6._12_4_ = auVar4._12_4_;
    auVar7 = pshuflw(auVar6,auVar6,0xe8);
    auVar7 = pshufhw(auVar7,auVar7,0xe8);
    uVar3 = CONCAT44(auVar7._8_4_,auVar7._0_4_);
  }
  d->_q_MMXReg[0] = uVar3;
  return;
}

Assistant:

void glue(helper_psllw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int shift;

    if (s->Q(0) > 15) {
        d->Q(0) = 0;
#if SHIFT == 1
        d->Q(1) = 0;
#endif
    } else {
        shift = s->B(0);
        d->W(0) <<= shift;
        d->W(1) <<= shift;
        d->W(2) <<= shift;
        d->W(3) <<= shift;
#if SHIFT == 1
        d->W(4) <<= shift;
        d->W(5) <<= shift;
        d->W(6) <<= shift;
        d->W(7) <<= shift;
#endif
    }
}